

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfsm-builder.h
# Opt level: O2

Expression * __thiscall
cnn::ClassFactoredSoftmaxBuilder::get_rc2w(ClassFactoredSoftmaxBuilder *this,uint cluster_idx)

{
  Expression *pEVar1;
  pointer pEVar2;
  ComputationGraph *local_20;
  uint local_18;
  
  pEVar2 = (this->rc2ws).
           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl
           .super__Vector_impl_data._M_start;
  pEVar1 = pEVar2 + cluster_idx;
  if (pEVar2[cluster_idx].pg == (ComputationGraph *)0x0) {
    cnn::expr::parameter((ComputationGraph *)&stack0xffffffffffffffe0,(Parameters *)this->pcg);
    pEVar1->pg = local_20;
    (pEVar1->i).t = local_18;
  }
  return pEVar1;
}

Assistant:

inline expr::Expression& get_rc2w(unsigned cluster_idx) {
    expr::Expression& e = rc2ws[cluster_idx];
    if (!e.pg)
      e = expr::parameter(*pcg, p_rc2ws[cluster_idx]);
    return e;
  }